

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O3

mbedtls_md_info_t * mbedtls_md_info_from_string(char *md_name)

{
  int iVar1;
  mbedtls_md_info_t *pmVar2;
  mbedtls_md_info_t *pmVar3;
  char *__s1;
  md_name_entry *pmVar4;
  
  if (md_name == (char *)0x0) {
    return (mbedtls_md_info_t *)0x0;
  }
  pmVar4 = md_names;
  __s1 = "SHA224";
  do {
    iVar1 = strcmp(__s1,md_name);
    if (iVar1 == 0) goto LAB_00225f2f;
    __s1 = pmVar4[1].md_name;
    pmVar4 = pmVar4 + 1;
  } while (__s1 != (char *)0x0);
  pmVar4 = (md_name_entry *)0x2b6100;
LAB_00225f2f:
  pmVar3 = (mbedtls_md_info_t *)0x0;
  if (pmVar4->md_type == MBEDTLS_MD_SHA256) {
    pmVar3 = &mbedtls_sha256_info;
  }
  pmVar2 = &mbedtls_sha224_info;
  if (pmVar4->md_type != MBEDTLS_MD_SHA224) {
    pmVar2 = pmVar3;
  }
  return pmVar2;
}

Assistant:

const mbedtls_md_info_t *mbedtls_md_info_from_string(const char *md_name)
{
    if (NULL == md_name) {
        return NULL;
    }

    const md_name_entry *entry = md_names;
    while (entry->md_name != NULL &&
           strcmp(entry->md_name, md_name) != 0) {
        ++entry;
    }

    return mbedtls_md_info_from_type(entry->md_type);
}